

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table_visitor.cpp
# Opt level: O3

void __thiscall
symbol_table_visitor::assert_type(symbol_table_visitor *this,Type *checking,Type *needed)

{
  size_t __n;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = checking->name->_M_string_length;
  if ((__n == needed->name->_M_string_length) &&
     (((__n == 0 ||
       (iVar1 = bcmp((checking->name->_M_dataplus)._M_p,(needed->name->_M_dataplus)._M_p,__n),
       iVar1 == 0)) && (checking->is_array == needed->is_array)))) {
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(&local_70,"syntax error: got ",checking->name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_90 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_50._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar4) {
    local_50.field_2._M_allocated_capacity = *psVar4;
    local_50.field_2._8_8_ = plVar2[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar4;
  }
  local_50._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_d0,&local_50,needed->name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(__return_storage_ptr__,&local_b0," expected");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void symbol_table_visitor::assert_type(const Type* checking, const Type* needed) {
    if (*checking->name != *needed->name || checking->is_array != needed->is_array) {
        throw "syntax error: got " + *checking->name + (checking->is_array ? "[]" : "") + 
            ", " + *needed->name + (needed->is_array ? "[]" : "") + " expected";
    }
}